

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

void free_buf(BUFFER *buffer)

{
  BUFFER *in_RDI;
  
  if ((in_RDI != (BUFFER *)0x0) && ((in_RDI->valid & 1U) != 0)) {
    if (in_RDI->string != (char *)0x0) {
      free_pstring((char *)buffer);
    }
    in_RDI->string = (char *)0x0;
    in_RDI->size = 0;
    in_RDI->state = 2;
    in_RDI->valid = false;
    in_RDI->next = buf_free;
    buf_free = in_RDI;
  }
  return;
}

Assistant:

void free_buf(BUFFER *buffer)
{
	if (!(buffer != nullptr && buffer->valid))
		return;

	if (buffer->string)
		free_pstring(buffer->string);

	buffer->string = nullptr;
	buffer->size = 0;
	buffer->state = BUFFER_FREED;

	buffer->valid = false;
	buffer->next = buf_free;
	buf_free = buffer;
}